

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::Identification::Copy(Identification *this,Identification *rhs)

{
  undefined8 uVar1;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  (this->ThisGenerationUID).super_Identifier<16U>.m_HasValue =
       (rhs->ThisGenerationUID).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->ThisGenerationUID).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->ThisGenerationUID).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->ThisGenerationUID).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->ThisGenerationUID).super_Identifier<16U>.m_Value + 8) = uVar1;
  std::__cxx11::string::_M_assign((string *)&(this->CompanyName).super_string);
  std::__cxx11::string::_M_assign((string *)&(this->ProductName).super_string);
  (this->ProductVersion).Major = (rhs->ProductVersion).Major;
  (this->ProductVersion).Minor = (rhs->ProductVersion).Minor;
  (this->ProductVersion).Patch = (rhs->ProductVersion).Patch;
  (this->ProductVersion).Build = (rhs->ProductVersion).Build;
  (this->ProductVersion).Release = (rhs->ProductVersion).Release;
  std::__cxx11::string::_M_assign((string *)&(this->VersionString).super_string);
  (this->ProductUID).super_Identifier<16U>.m_HasValue =
       (rhs->ProductUID).super_Identifier<16U>.m_HasValue;
  uVar1 = *(undefined8 *)((rhs->ProductUID).super_Identifier<16U>.m_Value + 8);
  *(undefined8 *)(this->ProductUID).super_Identifier<16U>.m_Value =
       *(undefined8 *)(rhs->ProductUID).super_Identifier<16U>.m_Value;
  *(undefined8 *)((this->ProductUID).super_Identifier<16U>.m_Value + 8) = uVar1;
  Kumu::Timestamp::operator=(&this->ModificationDate,&rhs->ModificationDate);
  (this->ToolkitVersion).Major = (rhs->ToolkitVersion).Major;
  (this->ToolkitVersion).Minor = (rhs->ToolkitVersion).Minor;
  (this->ToolkitVersion).Patch = (rhs->ToolkitVersion).Patch;
  (this->ToolkitVersion).Build = (rhs->ToolkitVersion).Build;
  (this->ToolkitVersion).Release = (rhs->ToolkitVersion).Release;
  std::__cxx11::string::_M_assign((string *)&(this->Platform).m_property.super_string);
  (this->Platform).m_has_value = (rhs->Platform).m_has_value;
  return;
}

Assistant:

void
Identification::Copy(const Identification& rhs)
{
  InterchangeObject::Copy(rhs);
  ThisGenerationUID = rhs.ThisGenerationUID;
  CompanyName = rhs.CompanyName;
  ProductName = rhs.ProductName;
  ProductVersion = rhs.ProductVersion;
  VersionString = rhs.VersionString;
  ProductUID = rhs.ProductUID;
  ModificationDate = rhs.ModificationDate;
  ToolkitVersion = rhs.ToolkitVersion;
  Platform = rhs.Platform;
}